

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

int dump_cb(void *sysdata,void *userdata)

{
  prf_nodeinfo_t *ppVar1;
  
  ppVar1 = prf_nodeinfo_get(**(uint16_t **)((long)sysdata + 8));
  dump_cb::dump_indent[(ulong)*(ushort *)((long)sysdata + 0x76) * 2] = '\0';
  printf("%sopcode %d, name \"%s\", size %d\n",dump_cb::dump_indent,(ulong)ppVar1->opcode,
         ppVar1->name,(ulong)*(ushort *)(*(long *)((long)sysdata + 8) + 2));
  if (**(short **)((long)sysdata + 8) == 0x43) {
    printf("    => vertex palette size: %d\n",(ulong)**(uint **)(*(short **)((long)sysdata + 8) + 4)
          );
  }
  dump_cb::dump_indent[(ulong)*(ushort *)((long)sysdata + 0x76) * 2] = ' ';
  return 1;
}

Assistant:

static
int
dump_cb(
    void * sysdata,
    void * userdata )
{
    prf_state_t * state;
    prf_nodeinfo_t * nodeinfo;
    static char dump_indent[] = "                                                                                                                                                                                                ";

    state = (prf_state_t *) sysdata;

    nodeinfo = prf_nodeinfo_get( state->node->opcode );
    assert( nodeinfo != NULL );

    dump_indent[ PRF_ABS( 2 * state->push_level ) ] = '\0';

    printf( "%sopcode %d, name \"%s\", size %d\n", dump_indent,
            nodeinfo->opcode, nodeinfo->name,
            state->node->length );

    if ( state->node->opcode == 67 )
        printf( "    => vertex palette size: %d\n",
            ((uint32_t *)(state->node->data))[0] );

    dump_indent[ PRF_ABS( 2 * state->push_level ) ] = ' ';

    return PRF_TRAV_CONTINUE;
}